

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-home-notice.c
# Opt level: O0

void borg_notice_home_dupe(borg_item_conflict *item,_Bool check_sval,int i)

{
  _Bool _Var1;
  ego_item *e_ptr;
  borg_item_conflict *item2;
  int x;
  int dupe_count;
  int i_local;
  _Bool check_sval_local;
  borg_item_conflict *item_local;
  
  _Var1 = borg_ego_has_random_power(e_info + item->ego_idx);
  if ((!_Var1) && ((item->needs_ident & 1U) == 0)) {
    item2._4_4_ = item->iqty - 1;
    for (item2._0_4_ = 0; (int)item2 < i; item2._0_4_ = (int)item2 + 1) {
      if ((int)item2 < (int)(uint)z_info->store_inven_max) {
        e_ptr = (ego_item *)(borg_shops[7].ware + (int)item2);
      }
      else {
        e_ptr = (ego_item *)
                (borg_items +
                (int)(((int)item2 - (uint)z_info->store_inven_max) + (uint)z_info->pack_size));
      }
      if ((((((char)e_ptr->modifiers[3].sides != '\0') &&
            ((e_ptr->modifiers[3].base & 0x10000) != 0)) &&
           (item->tval == (uint8_t)e_ptr->modifiers[3].dice)) &&
          ((!check_sval || (item->sval == *(uint8_t *)((long)&e_ptr->modifiers[3].dice + 1))))) &&
         ((item->art_idx == (uint8_t)e_ptr->modifiers[3].m_bonus &&
          (item->ego_idx == *(uint8_t *)((long)&e_ptr->modifiers[3].m_bonus + 1))))) {
        item2._4_4_ = item2._4_4_ + 1;
      }
    }
    if ((item->tval == '\x15') && (item2._4_4_ != 0)) {
      item2._4_4_ = item2._4_4_ + -1;
    }
    num_duplicate_items = num_duplicate_items + (short)item2._4_4_;
  }
  return;
}

Assistant:

static void borg_notice_home_dupe(borg_item *item, bool check_sval, int i)
{
    /* eventually check for power overlap... armor of resistance is same as weak
     * elvenkind.*/
    /*  two armors of elvenkind that resist poison is a dupe.  AJG*/

    int              dupe_count, x;
    borg_item       *item2;
    struct ego_item *e_ptr = &e_info[item->ego_idx];

    /* check for a duplicate.  */
    /* be carefull about extra powers (elvenkind/magi) */
    if (borg_ego_has_random_power(e_ptr))
        return;

    /* if it isn't identified, it isn't duplicate */
    if (item->needs_ident)
        return;

    /* if this is a stack of items then all after the first are a */
    /* duplicate */
    dupe_count = item->iqty - 1;

    /* Look for other items before this one that are the same */
    for (x = 0; x < i; x++) {
        if (x < z_info->store_inven_max)
            item2 = &borg_shops[BORG_HOME].ware[x];
        else
            /* Check what the borg has on as well.*/
            item2 = &borg_items[((x - z_info->store_inven_max) + INVEN_WIELD)];

        /* skip zero quantity or unknown items */
        if (!item2->iqty || !item2->aware)
            continue;

        /* if everything matches it is a duplicate item */
        /* Note that we only check sval on certain items.  This */
        /* is because, for example, two pairs of dragon armor */
        /* are not the same unless their subtype (color) matches */
        /* but a defender is a defender even if one is a dagger and */
        /* one is a mace */
        if ((item->tval == item2->tval)
            && (check_sval ? (item->sval == item2->sval) : true)
            && (item->art_idx == item2->art_idx)
            && (item->ego_idx == item2->ego_idx)) {
            dupe_count++;
        }
    }

    /* there can be one dupe of rings because there are two ring slots. */
    if (item->tval == TV_RING && dupe_count)
        dupe_count--;

    /* Add this items count to the total duplicate count */
    num_duplicate_items += dupe_count;
}